

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

string * __thiscall pbrt::CurveCommon::ToString_abi_cxx11_(CurveCommon *this)

{
  string *in_RDI;
  span<const_pbrt::Point3<float>_> sVar1;
  span<const_float> sVar2;
  span<const_pbrt::Normal3<float>_> sVar3;
  float *unaff_retaddr;
  float *in_stack_00000008;
  Transform *in_stack_00000010;
  Transform *in_stack_00000018;
  bool *in_stack_00000020;
  bool *in_stack_00000028;
  Point3<float> *fmt;
  
  sVar1 = pstd::MakeSpan<const_pbrt::Point3<float>,_4UL>((Point3<float> (*) [4])0x45f2ef);
  fmt = sVar1.ptr;
  sVar2 = pstd::MakeSpan<const_float,_2UL>((float (*) [2])0x45f307);
  sVar3 = pstd::MakeSpan<const_pbrt::Normal3<float>,_2UL>((Normal3<float> (*) [2])0x45f31f);
  StringPrintf<pbrt::CurveType_const&,pstd::span<pbrt::Point3<float>const>,pstd::span<float_const>,pstd::span<pbrt::Normal3<float>const>,float_const&,float_const&,pbrt::Transform_const&,pbrt::Transform_const&,bool_const&,bool_const&>
            ((char *)fmt,(CurveType *)sVar2.n,(span<const_pbrt::Point3<float>_> *)sVar2.ptr,
             (span<const_float> *)sVar3.n,(span<const_pbrt::Normal3<float>_> *)sVar3.ptr,
             unaff_retaddr,in_stack_00000008,in_stack_00000010,in_stack_00000018,in_stack_00000020,
             in_stack_00000028);
  return in_RDI;
}

Assistant:

std::string CurveCommon::ToString() const {
    return StringPrintf(
        "[ CurveCommon type: %s cpObj: %s width: %s n: %s normalAngle: %f "
        "invSinNormalAngle: %f renderFromObject: %s "
        "objectFromRender: %s "
        "reverseOrientation: %s transformSwapsHandedness: %s ]",
        type, pstd::MakeSpan(cpObj), pstd::MakeSpan(width), pstd::MakeSpan(n),
        normalAngle, invSinNormalAngle, *renderFromObject, *objectFromRender,
        reverseOrientation, transformSwapsHandedness);
}